

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber-unix.cpp
# Opt level: O0

void __thiscall
cilk_fiber_sysdep::suspend_self_and_resume_other_sysdep
          (cilk_fiber_sysdep *this,cilk_fiber_sysdep *other)

{
  bool bVar1;
  cilk_fiber_sysdep *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar2;
  cilk_fiber_sysdep *other_local;
  cilk_fiber_sysdep *this_local;
  
  bVar1 = cilk_fiber::is_resumable(&this->super_cilk_fiber);
  if (!bVar1) {
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/cilk_fiber-unix.cpp"
                  ,0x97,"this->is_resumable()");
  }
  this->m_resume_jmpbuf[0] = &stack0xfffffffffffffff8;
  this->m_resume_jmpbuf[2] = &stack0xffffffffffffffa8;
  this->m_resume_jmpbuf[1] = &DAT_0011850c;
  uVar2 = 0;
  resume_other_sysdep(in_stack_ffffffffffffffa8,(cilk_fiber_sysdep *)0x1184f4);
  cilk_fiber::do_post_switch_actions((cilk_fiber *)CONCAT44(uVar2,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

void cilk_fiber_sysdep::suspend_self_and_resume_other_sysdep(cilk_fiber_sysdep* other)
{
#if SUPPORT_GET_CURRENT_FIBER
    cilkos_set_tls_cilk_fiber(other);
#endif
    CILK_ASSERT(this->is_resumable());


    // Jump to the other fiber.  We expect to come back.
    if (! CILK_SETJMP(m_resume_jmpbuf)) {
        resume_other_sysdep(other);
    }

    // Return here when another fiber resumes me.
    // If the fiber that switched to me wants to be deallocated, do it now.
    do_post_switch_actions();
}